

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.h
# Opt level: O0

poly_entry_descriptor *
polyq::poly_entry<agge::worker<std::pair<int,double>>::work_in>::
prepare_slot<agge::(anonymous_namespace)::work<12>>
          (ptr_type *at,ptr_type start,ptr_type end,work<12> *value)

{
  poly_entry_descriptor *ppVar1;
  undefined1 local_29;
  work<12> *pwStack_28;
  type_check_t type_check;
  work<12> *value_local;
  ptr_type end_local;
  ptr_type start_local;
  ptr_type *at_local;
  
  pwStack_28 = value;
  poly_entry<agge::worker<std::pair<int,double>>::work_in>::prepare_slot<agge::(anonymous_namespace)
  ::work<12>>(unsigned_char*&,unsigned_char*,unsigned_char*,agge::(anonymous_namespace)::
  work<12>const&)::type_check_t::type_check_t(agge::worker<std::pair<int,double>>::work_in_const__
            (&local_29,&value->super_work_in);
  if ((long)end - (long)*at < 4) {
    *at = start;
  }
  else if ((long)end - (long)*at < 0x14) {
    ppVar1 = poly_entry_descriptor::from(*at);
    ppVar1->size = 0;
    *at = start;
  }
  ppVar1 = poly_entry_descriptor::from(*at);
  return ppVar1;
}

Assistant:

static poly_entry_descriptor *prepare_slot(ptr_type &at, ptr_type start, ptr_type end, const FinalT &value) throw()
		{
			struct type_check_t { type_check_t(const T *) {	} } type_check(&value);

			if (end - at < static_cast<int>(sizeof(poly_entry_descriptor)))
				at = start;
			else if (end - at < static_cast<int>(sizeof(poly_entry_descriptor) + sizeof(FinalT)))
				poly_entry_descriptor::from(at).size = 0, at = start;
			return &poly_entry_descriptor::from(at);
		}